

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

Instr * Peeps::PeepUnreachableLabel(LabelInstr *deadLabel,bool isInHelper,bool *peepedRef)

{
  IRKind IVar1;
  OpCode OVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  ulong in_RAX;
  undefined4 *puVar6;
  LabelInstr *pLVar7;
  Instr *pIVar8;
  undefined8 uStack_38;
  bool wasStatementBoundaryKeptInDeadBlock;
  
  uStack_38 = in_RAX;
  if (deadLabel == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x3a6,"(deadLabel)","deadLabel");
    if (!bVar4) goto LAB_0061bdcc;
    *puVar6 = 0;
  }
  pLVar7 = deadLabel;
  if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
       (deadLabel->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next != &deadLabel->labelRefs) ||
     ((deadLabel->field_0x78 & 4) != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x3a7,"(deadLabel->IsUnreferenced())","deadLabel->IsUnreferenced()");
    if (!bVar4) {
LAB_0061bdcc:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  do {
    pLVar7 = (LabelInstr *)IR::Instr::GetPrevRealInstrOrLabel(&pLVar7->super_Instr);
    IVar1 = (pLVar7->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      if (IVar1 == InstrKindBranch) {
        OVar2 = (pLVar7->super_Instr).m_opcode;
        if (OVar2 < ADD) {
          if ((OVar2 == Br) || (OVar2 == MultiBr)) goto LAB_0061bd7c;
        }
        else {
          bVar4 = LowererMD::IsUnconditionalBranch((Instr *)pLVar7);
          if (bVar4) goto LAB_0061bd7c;
        }
      }
      break;
    }
  } while (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
            (pLVar7->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
            super_SListNodeBase<Memory::ArenaAllocator>.next == &pLVar7->labelRefs) &&
          ((pLVar7->field_0x78 & 4) == 0));
  bVar4 = OpCodeAttr::HasFallThrough((pLVar7->super_Instr).m_opcode);
  if (bVar4) {
    pIVar8 = (deadLabel->super_Instr).m_next;
    bVar5 = ((deadLabel->field_0x78 & 2) == 0) != isInHelper && (deadLabel->field_0x78 & 0x20) == 0;
    if (peepedRef != (bool *)0x0) {
      *peepedRef = (bool)bVar5;
    }
  }
  else {
LAB_0061bd7c:
    uStack_38 = uStack_38 & 0xffffffffffffff;
    pIVar8 = RemoveDeadBlock((deadLabel->super_Instr).m_next,(bool *)((long)&uStack_38 + 7));
    if (peepedRef != (bool *)0x0) {
      *peepedRef = true;
    }
    bVar5 = uStack_38._7_1_ ^ 1;
  }
  if (((bVar5 != 0) &&
      ((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
       (deadLabel->labelRefs).super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
       super_SListNodeBase<Memory::ArenaAllocator>.next == &deadLabel->labelRefs)) &&
     ((deadLabel->field_0x78 & 4) == 0)) {
    IR::Instr::Remove(&deadLabel->super_Instr);
  }
  return pIVar8;
}

Assistant:

IR::Instr *
Peeps::PeepUnreachableLabel(IR::LabelInstr *deadLabel, const bool isInHelper, bool *const peepedRef)
{
    Assert(deadLabel);
    Assert(deadLabel->IsUnreferenced());

    IR::Instr *prevFallthroughInstr = deadLabel;
    do
    {
        prevFallthroughInstr = prevFallthroughInstr->GetPrevRealInstrOrLabel();
        // The previous dead label may have been kept around due to a StatementBoundary, see comment in RemoveDeadBlock.
    } while(prevFallthroughInstr->IsLabelInstr() && prevFallthroughInstr->AsLabelInstr()->IsUnreferenced());

    IR::Instr *instrReturn;
    bool removeLabel;

    // If code is now unreachable, delete block
    if (!prevFallthroughInstr->HasFallThrough())
    {
        bool wasStatementBoundaryKeptInDeadBlock = false;
        instrReturn = RemoveDeadBlock(deadLabel->m_next, &wasStatementBoundaryKeptInDeadBlock);

        // Remove label only if we didn't have to keep last StatementBoundary in the dead block,
        // see comment in RemoveDeadBlock.
        removeLabel = !wasStatementBoundaryKeptInDeadBlock;

        if(peepedRef)
        {
            *peepedRef = true;
        }
    }
    else
    {
        instrReturn = deadLabel->m_next;
        removeLabel =
            deadLabel->isOpHelper == isInHelper
#if DBG
            && !deadLabel->m_noHelperAssert
#endif
            ;
        if(peepedRef)
        {
            *peepedRef = removeLabel;
        }
    }

    if (removeLabel && deadLabel->IsUnreferenced())
    {
        deadLabel->Remove();
    }

    return instrReturn;
}